

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall Chainstate::LoadChainTip(Chainstate *this)

{
  pointer ppCVar1;
  uint256 *puVar2;
  BlockManager *this_00;
  bool bVar3;
  CCoinsViewCache *pCVar4;
  long *plVar5;
  CBlockIndex *pCVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string_view source_file;
  string_view logging_function;
  double local_98;
  int local_8c;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = CoinsTip(this);
  (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_48,pCVar4);
  plVar5 = (long *)std::
                   __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                             (&local_48,&local_28);
  if (plVar5 == &local_28) {
    __assert_fail("!coins_cache.GetBestBlock().IsNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x122c,"bool Chainstate::LoadChainTip()");
  }
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar6 = (CBlockIndex *)0x0;
  }
  else {
    pCVar6 = ppCVar1[-1];
  }
  if (pCVar6 == (CBlockIndex *)0x0) {
LAB_00afd18f:
    this_00 = this->m_blockman;
    (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_48,pCVar4);
    pCVar6 = ::node::BlockManager::LookupBlockIndex(this_00,(uint256 *)&local_48);
    bVar3 = pCVar6 != (CBlockIndex *)0x0;
    if (pCVar6 == (CBlockIndex *)0x0) goto LAB_00afd2d4;
    CChain::SetTip(&this->m_chain,pCVar6);
    PruneBlockIndexCandidates(this);
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar6 = (CBlockIndex *)0x0;
    }
    else {
      pCVar6 = ppCVar1[-1];
    }
    puVar2 = pCVar6->phashBlock;
    if (puVar2 == (uint256 *)0x0) {
LAB_00afd315:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_68 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    uStack_60 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_58 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_50 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    base_blob<256u>::ToString_abi_cxx11_(&local_48,&local_68);
    local_8c = (int)((ulong)((long)(this->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    FormatISO8601DateTime_abi_cxx11_(&local_88,(ulong)pCVar6->nTime);
    local_98 = GuessVerificationProgress
                         (&((this->m_chainman->m_options).chainparams)->chainTxData,pCVar6);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "LoadChainTip";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<std::__cxx11::string,int,std::__cxx11::string,double>
              (logging_function,source_file,0x1240,ALL,Info,(ConstevalFormatString<4U>)0xfd4d02,
               &local_48,&local_8c,&local_88,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    puVar2 = pCVar6->phashBlock;
    if (puVar2 == (uint256 *)0x0) goto LAB_00afd315;
    local_48._M_dataplus._M_p = *(pointer *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    local_48._M_string_length = *(size_type *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_48.field_2._M_allocated_capacity =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_48.field_2._8_8_ = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18)
    ;
    (*(pCVar4->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_68,pCVar4);
    auVar8[0] = -((char)local_58 == local_48.field_2._M_local_buf[0]);
    auVar8[1] = -(local_58._1_1_ == local_48.field_2._M_local_buf[1]);
    auVar8[2] = -(local_58._2_1_ == local_48.field_2._M_local_buf[2]);
    auVar8[3] = -(local_58._3_1_ == local_48.field_2._M_local_buf[3]);
    auVar8[4] = -(local_58._4_1_ == local_48.field_2._M_local_buf[4]);
    auVar8[5] = -(local_58._5_1_ == local_48.field_2._M_local_buf[5]);
    auVar8[6] = -(local_58._6_1_ == local_48.field_2._M_local_buf[6]);
    auVar8[7] = -(local_58._7_1_ == local_48.field_2._M_local_buf[7]);
    auVar8[8] = -((char)uStack_50 == local_48.field_2._M_local_buf[8]);
    auVar8[9] = -(uStack_50._1_1_ == local_48.field_2._M_local_buf[9]);
    auVar8[10] = -(uStack_50._2_1_ == local_48.field_2._M_local_buf[10]);
    auVar8[0xb] = -(uStack_50._3_1_ == local_48.field_2._M_local_buf[0xb]);
    auVar8[0xc] = -(uStack_50._4_1_ == local_48.field_2._M_local_buf[0xc]);
    auVar8[0xd] = -(uStack_50._5_1_ == local_48.field_2._M_local_buf[0xd]);
    auVar8[0xe] = -(uStack_50._6_1_ == local_48.field_2._M_local_buf[0xe]);
    auVar8[0xf] = -(uStack_50._7_1_ == local_48.field_2._M_local_buf[0xf]);
    auVar7[0] = -((char)local_68 == (char)local_48._M_dataplus._M_p);
    auVar7[1] = -(local_68._1_1_ == local_48._M_dataplus._M_p._1_1_);
    auVar7[2] = -(local_68._2_1_ == local_48._M_dataplus._M_p._2_1_);
    auVar7[3] = -(local_68._3_1_ == local_48._M_dataplus._M_p._3_1_);
    auVar7[4] = -(local_68._4_1_ == local_48._M_dataplus._M_p._4_1_);
    auVar7[5] = -(local_68._5_1_ == local_48._M_dataplus._M_p._5_1_);
    auVar7[6] = -(local_68._6_1_ == local_48._M_dataplus._M_p._6_1_);
    auVar7[7] = -(local_68._7_1_ == local_48._M_dataplus._M_p._7_1_);
    auVar7[8] = -((char)uStack_60 == (char)local_48._M_string_length);
    auVar7[9] = -(uStack_60._1_1_ == local_48._M_string_length._1_1_);
    auVar7[10] = -(uStack_60._2_1_ == local_48._M_string_length._2_1_);
    auVar7[0xb] = -(uStack_60._3_1_ == local_48._M_string_length._3_1_);
    auVar7[0xc] = -(uStack_60._4_1_ == local_48._M_string_length._4_1_);
    auVar7[0xd] = -(uStack_60._5_1_ == local_48._M_string_length._5_1_);
    auVar7[0xe] = -(uStack_60._6_1_ == local_48._M_string_length._6_1_);
    auVar7[0xf] = -(uStack_60._7_1_ == local_48._M_string_length._7_1_);
    auVar7 = auVar7 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00afd18f;
  }
  bVar3 = true;
LAB_00afd2d4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Chainstate::LoadChainTip()
{
    AssertLockHeld(cs_main);
    const CCoinsViewCache& coins_cache = CoinsTip();
    assert(!coins_cache.GetBestBlock().IsNull()); // Never called when the coins view is empty
    const CBlockIndex* tip = m_chain.Tip();

    if (tip && tip->GetBlockHash() == coins_cache.GetBestBlock()) {
        return true;
    }

    // Load pointer to end of best chain
    CBlockIndex* pindex = m_blockman.LookupBlockIndex(coins_cache.GetBestBlock());
    if (!pindex) {
        return false;
    }
    m_chain.SetTip(*pindex);
    PruneBlockIndexCandidates();

    tip = m_chain.Tip();
    LogPrintf("Loaded best chain: hashBestChain=%s height=%d date=%s progress=%f\n",
              tip->GetBlockHash().ToString(),
              m_chain.Height(),
              FormatISO8601DateTime(tip->GetBlockTime()),
              GuessVerificationProgress(m_chainman.GetParams().TxData(), tip));
    return true;
}